

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

send_result_t
zmq::send_multipart<std::array<zmq::message_t,1ul>&,void>
          (socket_ref s,array<zmq::message_t,_1UL> *msgs,send_flags flags)

{
  iterator pvVar1;
  bool bVar2;
  message_t *__n;
  iterator pvVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  send_flags b;
  int in_R8D;
  send_result_t sVar5;
  ssize_t local_68 [2];
  send_flags local_54;
  message_t *pmStack_50;
  send_flags msg_flags;
  message_t *next;
  size_t msg_count;
  iterator end_it;
  iterator it;
  array<zmq::message_t,_1UL> *paStack_28;
  send_flags flags_local;
  array<zmq::message_t,_1UL> *msgs_local;
  socket_ref s_local;
  bool local_10;
  
  it._4_4_ = flags;
  paStack_28 = msgs;
  msgs_local = (array<zmq::message_t,_1UL> *)s.super_socket_base._handle;
  end_it = std::begin<std::array<zmq::message_t,1ul>>(msgs);
  msg_count = (size_t)std::end<std::array<zmq::message_t,1ul>>(paStack_28);
  next = (message_t *)0x0;
  do {
    if (end_it == (iterator)msg_count) {
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)&s_local,(unsigned_long *)&next);
      uVar4 = extraout_RDX_00;
LAB_0017bd6c:
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
      sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)s_local.super_socket_base._handle;
      return (send_result_t)
             sVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    __n = std::next<zmq::message_t*>(end_it,1);
    b = sndmore;
    if (__n == (message_t *)msg_count) {
      b = none;
    }
    pmStack_50 = __n;
    local_54 = operator|(it._4_4_,b);
    local_68[0] = detail::socket_base::send
                            ((socket_base *)&msgs_local,(int)end_it,(void *)(ulong)local_54,
                             (size_t)__n,in_R8D);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_68);
    pvVar1 = end_it;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::begin<std::array<zmq::message_t,1ul>>(paStack_28);
      if (pvVar1 != pvVar3) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::array<zmq::message_t, 1> &]"
                     );
      }
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&s_local);
      uVar4 = extraout_RDX;
      goto LAB_0017bd6c;
    }
    next = (message_t *)((next->msg)._ + 1);
    end_it = pmStack_50;
  } while( true );
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}